

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O1

bool __thiscall
qclab::qgates::CPhase<std::complex<float>_>::equals
          (CPhase<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  float *pfVar1;
  float fVar2;
  Phase<std::complex<float>_> *pPVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  
  plVar7 = (long *)__dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                                  &CPhase<std::complex<float>>::typeinfo,0);
  if (plVar7 != (long *)0x0) {
    pPVar3 = (this->gate_)._M_t.
             super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<float>_>,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<float>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<float>_>_*,_false>.
             _M_head_impl;
    fVar2 = (pPVar3->angle_).cos_;
    pfVar1 = (float *)(plVar7[2] + 0x10);
    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
      fVar2 = (pPVar3->angle_).sin_;
      pfVar1 = (float *)(plVar7[2] + 0x14);
      if ((fVar2 == *pfVar1) &&
         ((!NAN(fVar2) && !NAN(*pfVar1) &&
          (*(int *)((long)plVar7 + 0xc) ==
           (this->super_QControlledGate2<std::complex<float>_>).controlState_)))) {
        lVar4 = plVar7[1];
        iVar5 = (**(code **)(*plVar7 + 0x78))(plVar7);
        if (((int)lVar4 < iVar5) &&
           (iVar5 = (this->super_QControlledGate2<std::complex<float>_>).control_,
           iVar6 = (*(this->super_QControlledGate2<std::complex<float>_>).
                     super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                     _vptr_QObject[0xf])(this), iVar5 < iVar6)) {
          return true;
        }
        lVar4 = plVar7[1];
        iVar5 = (**(code **)(*plVar7 + 0x78))(plVar7);
        if (iVar5 < (int)lVar4) {
          iVar5 = (this->super_QControlledGate2<std::complex<float>_>).control_;
          iVar6 = (*(this->super_QControlledGate2<std::complex<float>_>).
                    super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
                    _vptr_QObject[0xf])(this);
          return iVar6 < iVar5;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CP = CPhase< T > ;
          if ( const CP* p = dynamic_cast< const CP* >( &other ) ) {
            if ( p->angle() != this->angle() ) return false ;
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }